

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O1

void default_encrypt_cid(quicly_cid_encryptor_t *_self,quicly_cid_t *encrypted,void *reset_token,
                        quicly_cid_plaintext_t *plaintext)

{
  uint uVar1;
  _func_void_st_quicly_cid_encryptor_t_ptr_quicly_cid_t_ptr_void_ptr_quicly_cid_plaintext_t_ptr
  *p_Var2;
  ulong uVar3;
  ulong *puVar4;
  uint8_t buf [16];
  ulong local_28;
  uint local_20 [2];
  
  puVar4 = &local_28;
  p_Var2 = _self[1].encrypt_cid;
  if (*(long *)(*(long *)p_Var2 + 0x10) != 8) {
    if (*(long *)(*(long *)p_Var2 + 0x10) != 0x10) {
      __assert_fail("!\"unexpected block size\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                    ,0x80,
                    "void default_encrypt_cid(quicly_cid_encryptor_t *, quicly_cid_t *, void *, const quicly_cid_plaintext_t *)"
                   );
    }
    uVar3 = plaintext->node_id;
    puVar4 = (ulong *)local_20;
    local_28 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
               | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 |
               (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  }
  uVar1 = plaintext->master_id;
  *(uint *)puVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = *(uint *)&plaintext->field_0x4;
  *(uint *)((long)puVar4 + 4) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if ((undefined1 *)((long)puVar4 + (8 - (long)&local_28)) ==
      *(undefined1 **)(*(long *)p_Var2 + 0x10)) {
    (**(code **)(p_Var2 + 0x18))(p_Var2,encrypted,&local_28);
    encrypted->len = *(uint8_t *)(*(long *)_self[1].encrypt_cid + 0x10);
    if (reset_token != (void *)0x0) {
      generate_reset_token((st_quicly_default_encrypt_cid_t *)_self,reset_token,encrypted);
    }
    return;
  }
  __assert_fail("p - buf == self->cid_encrypt_ctx->algo->block_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/defaults.c"
                ,0x85,
                "void default_encrypt_cid(quicly_cid_encryptor_t *, quicly_cid_t *, void *, const quicly_cid_plaintext_t *)"
               );
}

Assistant:

static void default_encrypt_cid(quicly_cid_encryptor_t *_self, quicly_cid_t *encrypted, void *reset_token,
                                const quicly_cid_plaintext_t *plaintext)
{
    struct st_quicly_default_encrypt_cid_t *self = (void *)_self;
    uint8_t buf[16], *p;

    /* encode */
    p = buf;
    switch (self->cid_encrypt_ctx->algo->block_size) {
    case 8:
        break;
    case 16:
        p = quicly_encode64(p, plaintext->node_id);
        break;
    default:
        assert(!"unexpected block size");
        break;
    }
    p = quicly_encode32(p, plaintext->master_id);
    p = quicly_encode32(p, (plaintext->thread_id << 8) | plaintext->path_id);
    assert(p - buf == self->cid_encrypt_ctx->algo->block_size);

    /* generate CID */
    ptls_cipher_encrypt(self->cid_encrypt_ctx, encrypted->cid, buf, self->cid_encrypt_ctx->algo->block_size);
    encrypted->len = self->cid_encrypt_ctx->algo->block_size;

    /* generate stateless reset token if requested */
    if (reset_token != NULL)
        generate_reset_token(self, reset_token, encrypted->cid);
}